

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

void __thiscall Engine::simplifyDB(Engine *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint i;
  ulong uVar4;
  
  iVar3 = 0;
  for (uVar4 = 0; uVar1 = (this->propagators).sz, uVar4 < uVar1; uVar4 = uVar4 + 1) {
    iVar2 = (*(this->propagators).data[uVar4]->_vptr_Propagator[7])();
    iVar3 = iVar3 + iVar2;
  }
  iVar3 = uVar1 + iVar3;
  for (uVar4 = 0; uVar1 = (this->vars).sz, uVar4 < uVar1; uVar4 = uVar4 + 1) {
    iVar2 = IntVar::simplifyWatches((this->vars).data[uVar4]);
    iVar3 = iVar3 + iVar2;
  }
  this->next_simp_db = (long)(int)((uVar1 + iVar3) * 10) + this->propagations;
  return;
}

Assistant:

void Engine::simplifyDB() {
	int cost = 0;
	for (unsigned int i = 0; i < propagators.size(); i++) {
		cost += propagators[i]->checkSatisfied();
	}
	cost += propagators.size();
	for (unsigned int i = 0; i < vars.size(); i++) {
		cost += vars[i]->simplifyWatches();
	}
	cost += vars.size();
	cost *= 10;
	//  printf("simp db cost: %d\n", cost);
	next_simp_db = propagations + cost;
}